

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall FfsParser::parseDepexSectionBody(FfsParser *this,UModelIndex *index)

{
  char cVar1;
  TreeModel *this_00;
  bool bVar2;
  USTATUS UVar3;
  CBString *this_01;
  _Alloc_hider _Var4;
  CBString local_d0;
  FfsParser *local_b8;
  CBString local_b0;
  CBString local_98;
  CBString parsed;
  UByteArray body;
  EFI_GUID local_48;
  
  bVar2 = UModelIndex::isValid(index);
  if (!bVar2) {
    return 1;
  }
  local_b8 = this;
  TreeModel::body(&body,this->model,index);
  Bstrlib::CBString::CBString(&parsed);
  _Var4 = body.d._M_dataplus;
  if ((int)body.d._M_string_length < 2) {
    usprintf(&local_d0,"%s: DEPEX section too short","parseDepexSectionBody");
    msg(local_b8,&local_d0,index);
    Bstrlib::CBString::~CBString(&local_d0);
    UVar3 = 0x1c;
    goto LAB_0011d80c;
  }
  cVar1 = *body.d._M_dataplus._M_p;
  if (cVar1 == '\0') {
    if ((int)body.d._M_string_length != 0x12) {
      usprintf(&local_d0,"%s: DEPEX section too long for a section starting with BEFORE opcode",
               "parseDepexSectionBody");
      msg(local_b8,&local_d0,index);
LAB_0011d5a2:
      this_01 = &local_d0;
      goto LAB_0011d805;
    }
    Bstrlib::CBString::CBString(&local_b0,"\nBEFORE ");
    local_48._0_8_ = *(undefined8 *)(body.d._M_dataplus._M_p + 1);
    local_48.Data4 = *(UINT8 (*) [8])(body.d._M_dataplus._M_p + 9);
    guidToUString(&local_98,&local_48,true);
    Bstrlib::CBString::operator+(&local_d0,&local_b0,&local_98);
    Bstrlib::CBString::operator+=(&parsed,&local_d0);
    Bstrlib::CBString::~CBString(&local_d0);
    Bstrlib::CBString::~CBString(&local_98);
    Bstrlib::CBString::~CBString(&local_b0);
    if (body.d._M_dataplus._M_p[0x11] != '\b') {
      usprintf(&local_d0,"%s: DEPEX section ends with non-END opcode","parseDepexSectionBody");
      msg(local_b8,&local_d0,index);
      goto LAB_0011d5a2;
    }
  }
  else {
    if (cVar1 == '\x01') {
      if ((int)body.d._M_string_length == 0x12) {
        Bstrlib::CBString::CBString(&local_b0,"\nAFTER ");
        local_48._0_8_ = *(undefined8 *)(body.d._M_dataplus._M_p + 1);
        local_48.Data4 = *(UINT8 (*) [8])(body.d._M_dataplus._M_p + 9);
        guidToUString(&local_98,&local_48,true);
        Bstrlib::CBString::operator+(&local_d0,&local_b0,&local_98);
        Bstrlib::CBString::operator+=(&parsed,&local_d0);
        Bstrlib::CBString::~CBString(&local_d0);
        Bstrlib::CBString::~CBString(&local_98);
        Bstrlib::CBString::~CBString(&local_b0);
        if (body.d._M_dataplus._M_p[0x11] == '\b') goto LAB_0011d80a;
        usprintf(&local_d0,"%s: DEPEX section ends with non-END opcode","parseDepexSectionBody");
        msg(local_b8,&local_d0,index);
      }
      else {
        usprintf(&local_d0,"%s: DEPEX section too long for a section starting with AFTER opcode",
                 "parseDepexSectionBody");
        msg(local_b8,&local_d0,index);
      }
      goto LAB_0011d5a2;
    }
    if (cVar1 == '\t') {
      if ((int)body.d._M_string_length == 2) {
        usprintf(&local_d0,"%s: DEPEX section too short for a section starting with SOR opcode",
                 "parseDepexSectionBody");
        msg(local_b8,&local_d0,index);
        goto LAB_0011d5a2;
      }
      Bstrlib::CBString::CBString(&local_d0,"\nSOR");
      Bstrlib::CBString::operator+=(&parsed,&local_d0);
      Bstrlib::CBString::~CBString(&local_d0);
      _Var4._M_p = _Var4._M_p + 1;
    }
LAB_0011d5ea:
    if ((long)_Var4._M_p - (long)body.d._M_dataplus._M_p < (long)(int)body.d._M_string_length) {
      switch(*_Var4._M_p) {
      case '\0':
        usprintf(&local_d0,"%s: misplaced BEFORE opcode","parseDepexSectionBody");
        msg(local_b8,&local_d0,index);
        goto LAB_0011d5a2;
      case '\x01':
        usprintf(&local_d0,"%s: misplaced AFTER opcode","parseDepexSectionBody");
        msg(local_b8,&local_d0,index);
        goto LAB_0011d5a2;
      case '\x02':
        if ((uint)(((int)body.d._M_dataplus._M_p - (int)_Var4._M_p) + (int)body.d._M_string_length)
            < 0x12) {
          Bstrlib::CBString::clear(&parsed);
          usprintf(&local_d0,"%s: remains of DEPEX section too short for PUSH opcode",
                   "parseDepexSectionBody");
          msg(local_b8,&local_d0,index);
          goto LAB_0011d5a2;
        }
        Bstrlib::CBString::CBString(&local_b0,"\nPUSH ");
        local_48._0_8_ = *(undefined8 *)(_Var4._M_p + 1);
        local_48.Data4 = *(UINT8 (*) [8])(_Var4._M_p + 9);
        guidToUString(&local_98,&local_48,true);
        Bstrlib::CBString::operator+(&local_d0,&local_b0,&local_98);
        Bstrlib::CBString::operator+=(&parsed,&local_d0);
        Bstrlib::CBString::~CBString(&local_d0);
        Bstrlib::CBString::~CBString(&local_98);
        Bstrlib::CBString::~CBString(&local_b0);
        _Var4._M_p = _Var4._M_p + 0x11;
        goto LAB_0011d5ea;
      case '\x03':
        Bstrlib::CBString::CBString(&local_d0,"\nAND");
        Bstrlib::CBString::operator+=(&parsed,&local_d0);
        break;
      case '\x04':
        Bstrlib::CBString::CBString(&local_d0,"\nOR");
        Bstrlib::CBString::operator+=(&parsed,&local_d0);
        break;
      case '\x05':
        Bstrlib::CBString::CBString(&local_d0,"\nNOT");
        Bstrlib::CBString::operator+=(&parsed,&local_d0);
        break;
      case '\x06':
        Bstrlib::CBString::CBString(&local_d0,"\nTRUE");
        Bstrlib::CBString::operator+=(&parsed,&local_d0);
        break;
      case '\a':
        Bstrlib::CBString::CBString(&local_d0,"\nFALSE");
        Bstrlib::CBString::operator+=(&parsed,&local_d0);
        break;
      case '\b':
        goto switchD_0011d61d_caseD_8;
      case '\t':
        usprintf(&local_d0,"%s: misplaced SOR opcode","parseDepexSectionBody");
        msg(local_b8,&local_d0,index);
        goto LAB_0011d5a2;
      default:
        usprintf(&local_d0,"%s: unknown opcode %02Xh","parseDepexSectionBody");
        msg(local_b8,&local_d0,index);
        goto LAB_0011d5a2;
      }
      Bstrlib::CBString::~CBString(&local_d0);
      _Var4._M_p = _Var4._M_p + 1;
      goto LAB_0011d5ea;
    }
    this_00 = local_b8->model;
    Bstrlib::CBString::CBString(&local_b0,"\nParsed expression:");
    Bstrlib::CBString::operator+(&local_d0,&local_b0,&parsed);
    TreeModel::addInfo(this_00,index,&local_d0,true);
    Bstrlib::CBString::~CBString(&local_d0);
    this_01 = &local_b0;
LAB_0011d805:
    Bstrlib::CBString::~CBString(this_01);
  }
LAB_0011d80a:
  UVar3 = 0;
LAB_0011d80c:
  Bstrlib::CBString::~CBString(&parsed);
  std::__cxx11::string::~string((string *)&body);
  return UVar3;
switchD_0011d61d_caseD_8:
  Bstrlib::CBString::CBString(&local_d0,"\nEND");
  Bstrlib::CBString::operator+=(&parsed,&local_d0);
  Bstrlib::CBString::~CBString(&local_d0);
  _Var4._M_p = _Var4._M_p + 1;
  if ((long)_Var4._M_p - (long)body.d._M_dataplus._M_p < (long)(int)body.d._M_string_length) {
    Bstrlib::CBString::clear(&parsed);
    usprintf(&local_d0,"%s: DEPEX section ends with non-END opcode","parseDepexSectionBody");
    msg(local_b8,&local_d0,index);
    Bstrlib::CBString::~CBString(&local_d0);
  }
  goto LAB_0011d5ea;
}

Assistant:

USTATUS FfsParser::parseDepexSectionBody(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    UByteArray body = model->body(index);
    UString parsed;
    
    // Check data to be present
    if (body.size() < 2) { // 2 is a minimal sane value, i.e TRUE + END
        msg(usprintf("%s: DEPEX section too short", __FUNCTION__), index);
        return U_DEPEX_PARSE_FAILED;
    }
    
    const EFI_GUID * guid;
    const UINT8* current = (const UINT8*)body.constData();
    
    // Special cases of first opcode
    switch (*current) {
        case EFI_DEP_BEFORE:
            if (body.size() != 2 * EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID)) {
                msg(usprintf("%s: DEPEX section too long for a section starting with BEFORE opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            guid = (const EFI_GUID*)(current + EFI_DEP_OPCODE_SIZE);
            parsed += UString("\nBEFORE ") + guidToUString(readUnaligned(guid));
            current += EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID);
            if (*current != EFI_DEP_END){
                msg(usprintf("%s: DEPEX section ends with non-END opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            // No further parsing required
            return U_SUCCESS;
        case EFI_DEP_AFTER:
            if (body.size() != 2 * EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID)){
                msg(usprintf("%s: DEPEX section too long for a section starting with AFTER opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            guid = (const EFI_GUID*)(current + EFI_DEP_OPCODE_SIZE);
            parsed += UString("\nAFTER ") + guidToUString(readUnaligned(guid));
            current += EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID);
            if (*current != EFI_DEP_END) {
                msg(usprintf("%s: DEPEX section ends with non-END opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            // No further parsing required
            return U_SUCCESS;
        case EFI_DEP_SOR:
            if (body.size() <= 2 * EFI_DEP_OPCODE_SIZE) {
                msg(usprintf("%s: DEPEX section too short for a section starting with SOR opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            parsed += UString("\nSOR");
            current += EFI_DEP_OPCODE_SIZE;
            break;
    }
    
    // Parse the rest of depex
    while (current - (const UINT8*)body.constData() < body.size()) {
        switch (*current) {
            case EFI_DEP_BEFORE: {
                msg(usprintf("%s: misplaced BEFORE opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            case EFI_DEP_AFTER: {
                msg(usprintf("%s: misplaced AFTER opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            case EFI_DEP_SOR: {
                msg(usprintf("%s: misplaced SOR opcode", __FUNCTION__), index);
                return U_SUCCESS;
            }
            case EFI_DEP_PUSH:
                // Check that the rest of depex has correct size
                if ((UINT32)body.size() - (UINT32)(current - (const UINT8*)body.constData()) <= EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID)) {
                    parsed.clear();
                    msg(usprintf("%s: remains of DEPEX section too short for PUSH opcode", __FUNCTION__), index);
                    return U_SUCCESS;
                }
                guid = (const EFI_GUID*)(current + EFI_DEP_OPCODE_SIZE);
                parsed += UString("\nPUSH ") + guidToUString(readUnaligned(guid));
                current += EFI_DEP_OPCODE_SIZE + sizeof(EFI_GUID);
                break;
            case EFI_DEP_AND:
                parsed += UString("\nAND");
                current += EFI_DEP_OPCODE_SIZE;
                break;
            case EFI_DEP_OR:
                parsed += UString("\nOR");
                current += EFI_DEP_OPCODE_SIZE;
                break;
            case EFI_DEP_NOT:
                parsed += UString("\nNOT");
                current += EFI_DEP_OPCODE_SIZE;
                break;
            case EFI_DEP_TRUE:
                parsed += UString("\nTRUE");
                current += EFI_DEP_OPCODE_SIZE;
                break;
            case EFI_DEP_FALSE:
                parsed += UString("\nFALSE");
                current += EFI_DEP_OPCODE_SIZE;
                break;
            case EFI_DEP_END:
                parsed += UString("\nEND");
                current += EFI_DEP_OPCODE_SIZE;
                // Check that END is the last opcode
                if (current - (const UINT8*)body.constData() < body.size()) {
                    parsed.clear();
                    msg(usprintf("%s: DEPEX section ends with non-END opcode", __FUNCTION__), index);
                }
                break;
            default:
                msg(usprintf("%s: unknown opcode %02Xh", __FUNCTION__, *current), index);
                // No further parsing required
                return U_SUCCESS;
        }
    }
    
    // Add info
    model->addInfo(index, UString("\nParsed expression:") + parsed);
    
    return U_SUCCESS;
}